

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

bool duckdb::ConstantFun::TypeIsSupported(PhysicalType physical_type)

{
  InternalException *this;
  uint uVar1;
  undefined7 in_register_00000039;
  allocator local_39;
  string local_38;
  
  uVar1 = (uint)CONCAT71(in_register_00000039,physical_type);
  if (((0xc < uVar1) || ((0x1bfeU >> (uVar1 & 0x1f) & 1) == 0)) &&
     ((3 < uVar1 - 0xcb || (uVar1 - 0xcb == 2)))) {
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unsupported type for constant function",&local_39);
    InternalException::InternalException(this,&local_38);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return true;
}

Assistant:

bool ConstantFun::TypeIsSupported(const PhysicalType physical_type) {
	switch (physical_type) {
	case PhysicalType::BIT:
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::INT128:
	case PhysicalType::UINT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		return true;
	default:
		throw InternalException("Unsupported type for constant function");
	}
}